

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapped_transform.cc
# Opt level: O1

void __thiscall
webrtc::LappedTransform::BlockThunk::ProcessBlock
          (BlockThunk *this,float **input,size_t num_frames,size_t num_input_channels,
          size_t num_output_channels,float **output)

{
  RealFourier *pRVar1;
  LappedTransform *pLVar2;
  float **ppfVar3;
  int iVar4;
  float *pfVar5;
  complex<float> *pcVar6;
  string *result;
  float *__src;
  size_t sVar7;
  size_t block_length;
  size_t local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  float **local_1b8;
  size_t local_1b0;
  FatalMessage local_1a8;
  
  local_1d0 = num_output_channels;
  local_1c8 = num_frames;
  local_1c0 = num_input_channels;
  if (this->parent_->num_in_channels_ == num_input_channels) {
    result = (string *)0x0;
  }
  else {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&local_1c0,&this->parent_->num_in_channels_,
                        "num_input_channels == parent_->num_in_channels_");
  }
  if (result == (string *)0x0) {
    if (local_1d0 == this->parent_->num_out_channels_) {
      result = (string *)0x0;
    }
    else {
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         (&local_1d0,&this->parent_->num_out_channels_,
                          "num_output_channels == parent_->num_out_channels_");
    }
    if (result == (string *)0x0) {
      local_1b8 = output;
      if (this->parent_->block_length_ == local_1c8) {
        result = (string *)0x0;
      }
      else {
        result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                           (&this->parent_->block_length_,&local_1c8,
                            "parent_->block_length_ == num_frames");
      }
      if (result == (string *)0x0) {
        if (local_1c0 != 0) {
          sVar7 = 0;
          do {
            pfVar5 = AlignedArray<float>::Row(&this->parent_->real_buf_,sVar7);
            memcpy(pfVar5,input[sVar7],local_1c8 << 2);
            pRVar1 = (this->parent_->fft_)._M_t.
                     super___uniq_ptr_impl<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_webrtc::RealFourier_*,_std::default_delete<webrtc::RealFourier>_>
                     .super__Head_base<0UL,_webrtc::RealFourier_*,_false>._M_head_impl;
            pfVar5 = AlignedArray<float>::Row(&this->parent_->real_buf_,sVar7);
            pcVar6 = AlignedArray<std::complex<float>_>::Row(&this->parent_->cplx_pre_,sVar7);
            (*pRVar1->_vptr_RealFourier[2])(pRVar1,pfVar5,pcVar6);
            sVar7 = sVar7 + 1;
          } while (sVar7 < local_1c0);
        }
        iVar4 = RealFourier::FftOrder(0x144a61);
        local_1b0 = RealFourier::ComplexLength(iVar4);
        if (this->parent_->cplx_length_ == local_1b0) {
          result = (string *)0x0;
        }
        else {
          result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                             (&this->parent_->cplx_length_,&local_1b0,
                              "parent_->cplx_length_ == block_length");
        }
        ppfVar3 = local_1b8;
        if (result == (string *)0x0) {
          pLVar2 = this->parent_;
          (*pLVar2->block_processor_->_vptr_Callback[2])
                    (pLVar2->block_processor_,(pLVar2->cplx_pre_).head_row_,local_1c0,
                     pLVar2->cplx_length_,local_1d0,(pLVar2->cplx_post_).head_row_);
          if (local_1d0 != 0) {
            sVar7 = 0;
            do {
              pRVar1 = (this->parent_->fft_)._M_t.
                       super___uniq_ptr_impl<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_webrtc::RealFourier_*,_std::default_delete<webrtc::RealFourier>_>
                       .super__Head_base<0UL,_webrtc::RealFourier_*,_false>._M_head_impl;
              pcVar6 = AlignedArray<std::complex<float>_>::Row(&this->parent_->cplx_post_,sVar7);
              pfVar5 = AlignedArray<float>::Row(&this->parent_->real_buf_,sVar7);
              (*pRVar1->_vptr_RealFourier[3])(pRVar1,pcVar6,pfVar5);
              pfVar5 = ppfVar3[sVar7];
              __src = AlignedArray<float>::Row(&this->parent_->real_buf_,sVar7);
              memcpy(pfVar5,__src,local_1c8 << 2);
              sVar7 = sVar7 + 1;
            } while (sVar7 < local_1d0);
          }
          return;
        }
        iVar4 = 0x28;
      }
      else {
        iVar4 = 0x1d;
      }
    }
    else {
      iVar4 = 0x1c;
    }
  }
  else {
    iVar4 = 0x1b;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
             ,iVar4,result);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void LappedTransform::BlockThunk::ProcessBlock(const float* const* input,
                                               size_t num_frames,
                                               size_t num_input_channels,
                                               size_t num_output_channels,
                                               float* const* output) {
  RTC_CHECK_EQ(num_input_channels, parent_->num_in_channels_);
  RTC_CHECK_EQ(num_output_channels, parent_->num_out_channels_);
  RTC_CHECK_EQ(parent_->block_length_, num_frames);

  for (size_t i = 0; i < num_input_channels; ++i) {
    memcpy(parent_->real_buf_.Row(i), input[i],
           num_frames * sizeof(*input[0]));
    parent_->fft_->Forward(parent_->real_buf_.Row(i),
                           parent_->cplx_pre_.Row(i));
  }

  size_t block_length = RealFourier::ComplexLength(
      RealFourier::FftOrder(num_frames));
  RTC_CHECK_EQ(parent_->cplx_length_, block_length);
  parent_->block_processor_->ProcessAudioBlock(parent_->cplx_pre_.Array(),
                                               num_input_channels,
                                               parent_->cplx_length_,
                                               num_output_channels,
                                               parent_->cplx_post_.Array());

  for (size_t i = 0; i < num_output_channels; ++i) {
    parent_->fft_->Inverse(parent_->cplx_post_.Row(i),
                           parent_->real_buf_.Row(i));
    memcpy(output[i], parent_->real_buf_.Row(i),
           num_frames * sizeof(*input[0]));
  }
}